

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_selector.hpp
# Opt level: O0

int __thiscall
jsoncons::jsonpath::detail::
index_expression_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
::select(index_expression_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
         *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
        timeval *__timeout)

{
  bool bVar1;
  int extraout_EAX;
  path_node_type *this_00;
  undefined4 in_register_00000034;
  string_view_type sVar2;
  string_view_type sVar3;
  string_view_type sv;
  size_t start;
  value_type j;
  error_code ec;
  result_options in_stack_0000024c;
  reference in_stack_00000250;
  reference in_stack_00000258;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *in_stack_00000260;
  token_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *in_stack_00000268;
  error_code *in_stack_00000280;
  error_code *in_stack_ffffffffffffff00;
  result_options options;
  string_view_type *in_stack_ffffffffffffff08;
  fd_set *receiver;
  path_node_type *in_stack_ffffffffffffff10;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *in_stack_ffffffffffffff18;
  reference in_stack_ffffffffffffff20;
  reference root;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *in_stack_ffffffffffffff28;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *context;
  base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *in_stack_ffffffffffffff30;
  result_options in_stack_ffffffffffffff40;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  size_t in_stack_ffffffffffffff90;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  error_code local_40;
  timeval *local_30;
  fd_set *local_28;
  fd_set *local_20;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *local_18;
  reference local_10;
  index_expression_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *local_8;
  
  local_10 = (reference)CONCAT44(in_register_00000034,__nfds);
  local_30 = __timeout;
  local_28 = __exceptfds;
  local_20 = __writefds;
  local_18 = (eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
              *)__readfds;
  local_8 = this;
  std::error_code::error_code(in_stack_ffffffffffffff00);
  token_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  ::evaluate(in_stack_00000268,in_stack_00000260,in_stack_00000258,in_stack_00000250,
             in_stack_0000024c,in_stack_00000280);
  bVar1 = std::error_code::operator_cast_to_bool(&local_40);
  if (!bVar1) {
    bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is<unsigned_long>
                      ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x5b62bc)
    ;
    if ((bVar1) &&
       (bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_array
                          ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                           in_stack_ffffffffffffff18), bVar1)) {
      basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as<unsigned_long>
                ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff00);
      path_generator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
      ::generate(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                 (size_t)in_stack_ffffffffffffff08,
                 (result_options)((ulong)in_stack_ffffffffffffff00 >> 0x20));
      basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
      ::tail_select(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                    (path_node_type *)in_stack_ffffffffffffff18,(reference)in_stack_ffffffffffffff10
                    ,(node_receiver_type *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff40);
    }
    else {
      options = (result_options)((ulong)in_stack_ffffffffffffff00 >> 0x20);
      bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_string
                        ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                         in_stack_ffffffffffffff18);
      if ((bVar1) &&
         (bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_object
                            ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                             in_stack_ffffffffffffff18), bVar1)) {
        sVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_string_view
                          (in_stack_ffffffffffffff60);
        root = local_10;
        context = local_18;
        this_00 = path_generator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                  ::generate(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                             in_stack_ffffffffffffff08,options);
        receiver = local_28;
        sVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_string_view
                          (in_stack_ffffffffffffff60);
        basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                  (in_stack_ffffffffffffff48,(string_view_type *)sVar2._M_len);
        base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
        ::tail_select((base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                       *)this_00,context,root,(path_node_type *)sVar3._M_len,(reference)sVar3._M_str
                      ,(node_receiver_type *)receiver,(result_options)sVar2._M_len);
      }
    }
  }
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json
            ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x5b64f4);
  return extraout_EAX;
}

Assistant:

void select(eval_context<Json,JsonReference>& context,
                    reference root,
                    const path_node_type& last, 
                    reference current, 
                    node_receiver_type& receiver,
                    result_options options) const override
        {
            std::error_code ec;
            value_type j = expr_.evaluate(context, root, current, options, ec);

            if (!ec)
            {
                if (j.template is<std::size_t>() && current.is_array())
                {
                    std::size_t start = j.template as<std::size_t>();
                    this->tail_select(context, root, 
                                      path_generator_type::generate(context, last, start, options),
                                      current.at(start), receiver, options);
                }
                else if (j.is_string() && current.is_object())
                {
                    auto sv = j.as_string_view();
                    this->tail_select(context, root, 
                                      path_generator_type::generate(context, last, sv, options),
                                      current.at(j.as_string_view()), receiver, options);
                }
            }
        }